

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O1

void CheckRamLimitExceeded(void)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  char buf [64];
  char acStack_58 [64];
  
  cVar1 = CheckRamLimitExceeded()::notWarnedDisp;
  if (Options::IsLongPtr == '\0') {
    if (CurAddress < 0x10000) {
      CheckRamLimitExceeded()::notWarnedCurAdr = '\0';
    }
    else {
      if ((pass == 3) && (CheckRamLimitExceeded()::notWarnedCurAdr == '\0')) {
        pcVar3 = "DISP";
        if (PseudoORG == DISP_NONE) {
          pcVar3 = "ORG";
        }
        snprintf(acStack_58,0x40,"RAM limit exceeded 0x%X by %s",(ulong)(uint)CurAddress,pcVar3);
        Warning(acStack_58,(char *)0x0,W_PASS3);
        CheckRamLimitExceeded()::notWarnedCurAdr = '\x01';
      }
      if (PseudoORG != DISP_NONE) {
        CurAddress = CurAddress & 0xffff;
      }
    }
    bVar2 = 0xffff < adrdisp && PseudoORG != DISP_NONE;
    cVar1 = bVar2;
    if (((0xffff < adrdisp && PseudoORG != DISP_NONE) &&
        (cVar1 = CheckRamLimitExceeded()::notWarnedDisp, pass == 3)) &&
       (CheckRamLimitExceeded()::notWarnedDisp == '\0')) {
      snprintf(acStack_58,0x40,"RAM limit exceeded 0x%X by ORG");
      Warning(acStack_58,(char *)0x0,W_PASS3);
      cVar1 = bVar2;
    }
  }
  CheckRamLimitExceeded()::notWarnedDisp = cVar1;
  return;
}

Assistant:

void CheckRamLimitExceeded() {
	if (Options::IsLongPtr) return;		// in "longptr" mode with no device keep the address as is
	static bool notWarnedCurAdr = true;
	static bool notWarnedDisp = true;
	char buf[64];
	if (CurAddress >= 0x10000) {
		if (LASTPASS == pass && notWarnedCurAdr) {
			SPRINTF2(buf, 64, "RAM limit exceeded 0x%X by %s",
					 (unsigned int)CurAddress, DISP_NONE != PseudoORG ? "DISP":"ORG");
			Warning(buf);
			notWarnedCurAdr = false;
		}
		if (DISP_NONE != PseudoORG) CurAddress &= 0xFFFF;	// fake DISP address gets auto-wrapped FFFF->0
	} else notWarnedCurAdr = true;
	if (DISP_NONE != PseudoORG && adrdisp >= 0x10000) {
		if (LASTPASS == pass && notWarnedDisp) {
			SPRINTF1(buf, 64, "RAM limit exceeded 0x%X by ORG", (unsigned int)adrdisp);
			Warning(buf);
			notWarnedDisp = false;
		}
	} else notWarnedDisp = true;
}